

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O2

bool ON_EvaluateBezier(int dim,bool is_rat,int order,int cv_stride,double *cv,double t0,double t1,
                      int der_count,double t,int v_stride,double *v)

{
  uint uVar1;
  int der_count_00;
  double *cv_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint cv_stride_00;
  undefined7 in_register_00000031;
  double *pdVar6;
  size_t sz;
  double *pdVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  double *pdVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uchar stack_buffer [2048];
  double *local_860;
  double local_838 [257];
  
  cv_stride_00 = (int)CONCAT71(in_register_00000031,is_rat) + dim;
  uVar1 = cv_stride;
  if (cv_stride < (int)cv_stride_00) {
    uVar1 = cv_stride_00;
  }
  memset(v,0,(long)((der_count + 1) * v_stride) << 3);
  if ((t0 == t1) && (!NAN(t0) && !NAN(t1))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_evaluate_nurbs.cpp"
               ,0x21e,"","Invalid domain");
    return false;
  }
  der_count_00 = order + -1;
  iVar11 = der_count - der_count_00;
  iVar5 = 0;
  if (is_rat) {
    der_count_00 = der_count;
    iVar5 = iVar11 * cv_stride_00;
  }
  if (der_count < order) {
    iVar5 = 0;
    der_count_00 = der_count;
  }
  sz = (long)(int)(iVar5 + cv_stride_00 * order) << 3;
  if (sz < 0x801) {
    local_860 = (double *)0x0;
    cv_00 = local_838;
  }
  else {
    cv_00 = (double *)onmalloc(sz);
    local_860 = cv_00;
  }
  if (iVar5 != 0) {
    memset(cv_00 + (int)(cv_stride_00 * order),0,(long)iVar5 << 3);
  }
  lVar2 = (long)(int)cv_stride_00;
  if ((t0 != t) || (NAN(t0) || NAN(t))) {
    if (t <= (t0 + t1) * 0.5) {
      if ((t != t1) || (NAN(t) || NAN(t1))) goto LAB_0047f6b4;
    }
    pdVar12 = cv + (int)(uVar1 * order);
    pdVar6 = cv_00;
    iVar5 = order;
    while (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13) {
      pdVar12 = pdVar12 + -(long)(int)uVar1;
      memcpy(pdVar6,pdVar12,lVar2 * 8);
      pdVar6 = pdVar6 + lVar2;
    }
    dVar16 = t0 - t;
    dVar14 = 1.0 / (t1 - t0);
    dVar15 = (t1 - t) * dVar14;
    dVar14 = (t - t0) * dVar14;
  }
  else {
LAB_0047f6b4:
    pdVar12 = cv_00;
    iVar5 = 0;
    if (0 < order) {
      iVar5 = order;
    }
    while (iVar5 != 0) {
      memcpy(pdVar12,cv,lVar2 * 8);
      cv = cv + (int)uVar1;
      pdVar12 = pdVar12 + lVar2;
      iVar5 = iVar5 + -1;
    }
    pdVar12 = cv + -(long)(int)(uVar1 * order);
    dVar16 = t1 - t;
    dVar14 = 1.0 / (t1 - t0);
    dVar15 = (t - t0) * dVar14;
    dVar14 = dVar14 * dVar16;
  }
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    iVar5 = order;
    while (iVar5 = iVar5 + -1, pdVar6 = cv_00, pdVar7 = cv_00 + lVar2, iVar11 = iVar5, iVar5 != 0) {
      while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
        lVar9 = 0;
        for (lVar10 = 0; (uint)lVar10 != cv_stride_00; lVar10 = lVar10 + 1) {
          pdVar6[lVar10] = pdVar6[lVar10] * dVar14 + pdVar7[lVar10] * dVar15;
          lVar9 = lVar9 + -8;
        }
        pdVar6 = (double *)((long)pdVar6 - lVar9);
        pdVar7 = (double *)((long)pdVar7 - lVar9);
      }
    }
  }
  if ((((!is_rat) || (cv_00[dim] != 0.0)) || (NAN(cv_00[dim]))) ||
     (bVar13 = ON_RemoveBezierSingAt0(dim,order,cv_stride_00,cv_00), bVar13)) {
    if (der_count_00 != 0) {
      dVar14 = (double)order;
      iVar5 = der_count_00 + 1;
      if (order <= der_count_00) {
        iVar5 = order;
      }
      iVar11 = iVar5 * cv_stride_00;
      while (iVar5 = iVar5 + -1, iVar5 != 0) {
        dVar14 = dVar14 + -1.0;
        pdVar6 = cv_00 + iVar11 + -lVar2;
        pdVar7 = cv_00 + iVar11;
        iVar8 = iVar5;
        while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
          lVar9 = 0;
          for (lVar10 = 0; -cv_stride_00 != (int)lVar10; lVar10 = lVar10 + -1) {
            pdVar7[lVar10 + -1] =
                 (pdVar7[lVar10 + -1] - pdVar6[lVar10 + -1]) * (1.0 / dVar16) * dVar14;
            lVar9 = lVar9 + 8;
          }
          pdVar6 = (double *)((long)pdVar6 - lVar9);
          pdVar7 = (double *)((long)pdVar7 - lVar9);
        }
      }
    }
    if (order == 2) {
      if (cv_stride <= (int)cv_stride_00) {
        cv_stride = cv_stride_00;
      }
      uVar3 = 0;
      uVar4 = 0;
      if (0 < (int)cv_stride_00) {
        uVar4 = (ulong)cv_stride_00;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        dVar14 = pdVar12[uVar3];
        if ((dVar14 == pdVar12[(long)cv_stride + uVar3]) &&
           (!NAN(dVar14) && !NAN(pdVar12[(long)cv_stride + uVar3]))) {
          cv_00[uVar3] = dVar14;
        }
      }
    }
    if (is_rat) {
      ON_EvaluateQuotientRule(dim,der_count_00,cv_stride_00,cv_00);
    }
    for (iVar5 = 0; iVar5 <= der_count_00; iVar5 = iVar5 + 1) {
      memcpy(v,cv_00,(long)dim << 3);
      v = v + v_stride;
      cv_00 = cv_00 + lVar2;
    }
    bVar13 = true;
    if (local_860 != (double *)0x0) {
      onfree(local_860);
    }
  }
  else {
    if (local_860 != (double *)0x0) {
      onfree(local_860);
    }
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool ON_EvaluateBezier(
                int dim,              // dimension
                bool is_rat,          // true if NURBS is rational
                int order,            // order
                int cv_stride,        // cv_stride >= (is_rat)?dim+1:dim
                const double* cv,     // cv[order*cv_stride] array
                double t0, double t1, // domain
                int der_count,        // number of derivatives to compute
                double t,             // evaluation parameter
                int v_stride,         // v_stride (>=dimension)
                double* v             // v[(der_count+1)*v_stride] array
                )
/*****************************************************************************
Evaluate a Bezier
 
INPUT:
  dim
    (>= 1) dimension of Bezier's range
  is_rat
    0: bezier is not rational
    1: bezier is rational
  order
    (>= 2) (order = degree+1)
  cv
    array of (dim+is_rat)*order doubles that define the
    Bezier's control vertices.
  t0, t1  (t0 != t1)
    Bezier's domain.   Mathematically, Beziers have domain [0,1].  In practice
    Beziers are frequently evaluated at (t-t0)/(t1-t0) and the chain
    rule is used to evaluate the derivatives.  This function is the most
    efficient place to apply the chain rule.
  t
    Evaluation parameter
  der_count
    (>= 0)  number of derivatives to evaluate
  answer
     answer[i] is nullptr or points to an array of dim doubles.
OUTPUT:
  ON_EvBezier()
    0: successful
   -1: failure - rational function had nonzero numerator and zero
                 denominator
  answer
     bez(t)   = answer[0]
     bez'(t)  = answer[1]
              ...
        (n)
     bez  (t) = answer[n]
COMMENTS:
  Use de Casteljau's algorithm.  Rational functions with removable singularities
  (like x^2/x) are efficiently and correctly handled.
EXAMPLE:
  // ...
REFERENCE:
  AUTHOR page ?
RELATED FUNCTIONS:
  ON_EvaluatedeCasteljau
  ON_EvQuotientRule
  ON_EvNurb
  ON_EvPolynomialPoint
  ON_onvertBezierToPolynomial
  ON_onvertPolynomialToBezier
  ON_onvertNurbToBezier
*****************************************************************************/
{
  unsigned char stack_buffer[4*64*sizeof(double)];
  double delta_t;
  double alpha0;
  double alpha1;
  double *cv0, *cv1;
  int i, j, k; 
  double* CV, *tmp;
  void* free_me = 0;
  const int degree = order-1;
  const int cvdim = (is_rat)?dim+1:dim;

  if ( cv_stride < cvdim )
    cv_stride = cvdim;

  memset( v, 0, v_stride*(der_count+1)*sizeof(*v) );


  if (!(t0!=t1)) 
  {
    // Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-28304
    //  This test for valid domain was being done only in debug builds
    //  and not in release builds.  The #if defined(ON_DEBUG) projection
    //  has been here since 2005 when we switched to svn.
    //  I can't determine when or why it got added because it happened
    //  when we used SourceSafe or earlier version control.
    //  The bug was a crash in release builds, which skipped this test.
    //  I'm enabling the test in all builds and addeing a call to ON_ERROR().
    ON_ERROR("Invalid domain");
    return false;
  }

  i = order*cvdim;
  j = 0;
  if (der_count > degree) {
    if (is_rat)
      j = (der_count-degree)*cvdim;
    else {
      der_count = degree;
    }    
  }

  size_t sizeofCV = (i+j)*sizeof(*CV);

  CV = (double*)( (sizeofCV <= sizeof(stack_buffer)) ? stack_buffer : (free_me=onmalloc(sizeofCV)) );
  if (j) {
    memset( CV+i, 0, j*sizeof(*CV) );
  }
  cv0=CV;
  if (    t0 == t 
       || (t <= 0.5*(t0+t1) && t != t1) 
     ) 
  {
    for ( i = 0; i < order; i++ ) 
    {
      memcpy( cv0, cv, cvdim*sizeof(*cv0) );
      cv0 += cvdim;
      cv += cv_stride;
    }
    cv -= (cv_stride*order);
    delta_t = 1.0/(t1 - t);
    alpha1 = 1.0/(t1-t0);
    alpha0 = (t1-t)*alpha1;
    alpha1 *= t-t0;
  }
  else 
  {
    cv += (cv_stride*order);
    k=order;
    while(k--) 
    {
      cv -= cv_stride; 
      memcpy( cv0, cv, cvdim*sizeof(*cv0) );
      cv0 += cvdim;
    }
    delta_t = 1.0/(t0 - t);
    alpha0 = 1.0/(t1-t0);
    alpha1 = (t1-t)*alpha0;
    alpha0 *= t-t0;
  }

  /* deCasteljau (from the right) */
  if (alpha1 != 0.0) {
    j = order; while (--j) {
      cv0 = CV;
      cv1 = cv0 + cvdim;
      i = j; while (i--) {
        k = cvdim; 
        while (k--) {
          *cv0 = *cv0 * alpha0 + *cv1 * alpha1; 
          cv0++; 
          cv1++;
        }
      }
    }
  }
  
  /* check for removable singularity */
  if (is_rat && CV[dim] == 0.0)
  {
    if ( !ON_RemoveBezierSingAt0(dim,order,cvdim,CV) )
    {
      if ( free_me )
        onfree(free_me);  
      return false;
    }
  }

  /* Lee (from the right) */
  if (der_count) { 
    tmp=CV;
    alpha0 = order;
    j = (der_count>=order)?order:der_count+1;
    CV += cvdim*j; while(--j) {
      alpha0 -= 1.0; cv1 = CV; cv0 = cv1-cvdim;
      i=j; while(i--) {
        alpha1 = alpha0 * delta_t;
        k=cvdim; while(k--) {
          cv0--; 
          cv1--; 
          *cv1 = alpha1*(*cv1 - *cv0);
        }
      }
    }
    CV=tmp;
  }

  if ( 2 == order )
  {
    // 7 January 2004  Dale Lear
    //    Added to fix those cases when, numerically, t*a + (1.0-t)*a != a.
    //    Similar to fix for RR 9683.
    j = cv_stride;
    for ( i = 0; i < cvdim; i++, j++ )
    {
      if ( cv[i] == cv[j] )
      {
        CV[i] = cv[i];
      }
    }
  }

  if (is_rat) {
    ON_EvaluateQuotientRule( dim, der_count, cvdim, CV );
  }

  for (i=0;i<=der_count;i++) {
    memcpy( v, CV, dim*sizeof(*v) );
    v += v_stride;
    CV += cvdim;
  }

  if ( free_me )
    onfree(free_me);  

  return true;
}